

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_scroll.cpp
# Opt level: O2

void __thiscall DScroller::Serialize(DScroller *this,FSerializer *arc)

{
  FSerializer *pFVar1;
  
  DObject::Serialize((DObject *)this,arc);
  pFVar1 = FSerializer::Enum<EScroll>(arc,"type",&this->m_Type);
  pFVar1 = FSerializer::operator()(pFVar1,"dx",&this->m_dx);
  pFVar1 = FSerializer::operator()(pFVar1,"dy",&this->m_dy);
  pFVar1 = FSerializer::operator()(pFVar1,"affectee",&this->m_Affectee);
  pFVar1 = FSerializer::operator()(pFVar1,"control",&this->m_Control);
  pFVar1 = FSerializer::operator()(pFVar1,"lastheight",&this->m_LastHeight);
  pFVar1 = FSerializer::operator()(pFVar1,"vdx",&this->m_vdx);
  pFVar1 = FSerializer::operator()(pFVar1,"vdy",&this->m_vdy);
  pFVar1 = FSerializer::operator()(pFVar1,"accel",&this->m_Accel);
  pFVar1 = FSerializer::Enum<EScrollPos>(pFVar1,"parts",&this->m_Parts);
  FSerializer::Array<TObjPtr<DInterpolation>>
            (pFVar1,"interpolations",this->m_Interpolations,3,false);
  return;
}

Assistant:

void DScroller::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	arc.Enum("type", m_Type)
		("dx", m_dx)
		("dy", m_dy)
		("affectee", m_Affectee)
		("control", m_Control)
		("lastheight", m_LastHeight)
		("vdx", m_vdx)
		("vdy", m_vdy)
		("accel", m_Accel)
		.Enum("parts", m_Parts)
		.Array("interpolations", m_Interpolations, 3);
}